

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib530.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  timeval tVar6;
  int maxfd;
  int running;
  timeval interval;
  CURL *curl [4];
  fd_set wr;
  fd_set rd;
  fd_set exc;
  char target_url [256];
  int local_2f0;
  int local_2ec;
  timeval local_2e8;
  long local_2d8 [4];
  fd_set local_2b8;
  fd_set local_238;
  fd_set local_1b8;
  char local_138 [255];
  undefined1 local_39;
  
  local_2d8[0] = 0;
  local_2d8[1] = 0;
  local_2d8[2] = 0;
  local_2d8[3] = 0;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  iVar5 = 0;
  if (iVar1 != 0) {
    test_cold_1();
    iVar5 = iVar1;
  }
  if (iVar5 == 0) {
    lVar2 = curl_multi_init();
    if (lVar2 != 0) {
      lVar4 = 0;
LAB_0010264e:
      if (lVar4 == 4) {
        iVar1 = curl_multi_setopt(lVar2,3,1);
        iVar5 = 0;
        if (iVar1 != 0) {
          test_cold_8();
          iVar5 = iVar1;
        }
        if (iVar5 == 0) {
          fwrite("Start at URL 0\n",0xf,1,_stderr);
          iVar5 = 0;
          do {
            local_2f0 = -99;
            local_2e8.tv_sec = 1;
            local_2e8.tv_usec = 0;
            iVar1 = curl_multi_perform(lVar2,&local_2ec);
            if (iVar1 == 0) {
              if (local_2ec < 0) {
                fprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                        ,0x4e);
                iVar5 = 0x7a;
              }
            }
            else {
              test_cold_9();
              iVar5 = iVar1;
            }
            iVar1 = 0xf;
            if (iVar5 == 0) {
              tVar6 = tutil_tvnow();
              lVar4 = tutil_tvdiff(tVar6,tv_test_start);
              if (lVar4 < 0xea61) {
                if (local_2ec == 0) {
                  iVar5 = 0;
                  iVar1 = 0x2b;
                }
                else {
                  local_238.__fds_bits[0xe] = 0;
                  local_238.__fds_bits[0xf] = 0;
                  local_238.__fds_bits[0xc] = 0;
                  local_238.__fds_bits[0xd] = 0;
                  local_238.__fds_bits[10] = 0;
                  local_238.__fds_bits[0xb] = 0;
                  local_238.__fds_bits[8] = 0;
                  local_238.__fds_bits[9] = 0;
                  local_238.__fds_bits[6] = 0;
                  local_238.__fds_bits[7] = 0;
                  local_238.__fds_bits[4] = 0;
                  local_238.__fds_bits[5] = 0;
                  local_238.__fds_bits[2] = 0;
                  local_238.__fds_bits[3] = 0;
                  local_238.__fds_bits[0] = 0;
                  local_238.__fds_bits[1] = 0;
                  local_2b8.__fds_bits[0] = 0;
                  local_2b8.__fds_bits[1] = 0;
                  local_2b8.__fds_bits[2] = 0;
                  local_2b8.__fds_bits[3] = 0;
                  local_2b8.__fds_bits[4] = 0;
                  local_2b8.__fds_bits[5] = 0;
                  local_2b8.__fds_bits[6] = 0;
                  local_2b8.__fds_bits[7] = 0;
                  local_2b8.__fds_bits[8] = 0;
                  local_2b8.__fds_bits[9] = 0;
                  local_2b8.__fds_bits[10] = 0;
                  local_2b8.__fds_bits[0xb] = 0;
                  local_2b8.__fds_bits[0xc] = 0;
                  local_2b8.__fds_bits[0xd] = 0;
                  local_2b8.__fds_bits[0xe] = 0;
                  local_2b8.__fds_bits[0xf] = 0;
                  local_1b8.__fds_bits[0] = 0;
                  local_1b8.__fds_bits[1] = 0;
                  local_1b8.__fds_bits[2] = 0;
                  local_1b8.__fds_bits[3] = 0;
                  local_1b8.__fds_bits[4] = 0;
                  local_1b8.__fds_bits[5] = 0;
                  local_1b8.__fds_bits[6] = 0;
                  local_1b8.__fds_bits[7] = 0;
                  local_1b8.__fds_bits[8] = 0;
                  local_1b8.__fds_bits[9] = 0;
                  local_1b8.__fds_bits[10] = 0;
                  local_1b8.__fds_bits[0xb] = 0;
                  local_1b8.__fds_bits[0xc] = 0;
                  local_1b8.__fds_bits[0xd] = 0;
                  local_1b8.__fds_bits[0xe] = 0;
                  local_1b8.__fds_bits[0xf] = 0;
                  iVar5 = curl_multi_fdset(lVar2,&local_238,&local_2b8,&local_1b8,&local_2f0);
                  if (iVar5 == 0) {
                    iVar5 = 0;
                    if (local_2f0 < -1) {
                      fprintf(_stderr,
                              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                              ,0x59);
                      iVar5 = 0x7a;
                    }
                  }
                  else {
                    test_cold_11();
                  }
                  if (iVar5 == 0) {
                    iVar5 = select_wrapper(local_2f0 + 1,&local_238,&local_2b8,&local_1b8,&local_2e8
                                          );
                    if (iVar5 == -1) {
                      test_cold_12();
                      iVar5 = 0x79;
                    }
                    else {
                      tVar6 = tutil_tvnow();
                      lVar4 = tutil_tvdiff(tVar6,tv_test_start);
                      iVar1 = 0;
                      iVar5 = 0;
                      if (60000 < lVar4) {
                        test_cold_13();
                        iVar5 = 0x7d;
                        iVar1 = 0xf;
                      }
                    }
                  }
                }
              }
              else {
                test_cold_10();
                iVar5 = 0x7d;
              }
            }
          } while (iVar1 == 0);
          if ((iVar1 != 0x2b) && (iVar1 != 0xf)) goto LAB_001027df;
        }
      }
      else {
        lVar3 = curl_easy_init();
        local_2d8[lVar4] = lVar3;
        if (lVar3 == 0) {
          test_cold_3();
          iVar5 = 0x7c;
        }
        else {
          sprintf(local_138,"%s%04i",URL,(ulong)((int)lVar4 + 1));
          local_39 = 0;
          iVar1 = curl_easy_setopt(lVar3,0x2712,local_138);
          iVar5 = 0;
          if (iVar1 != 0) {
            test_cold_4();
            iVar5 = iVar1;
          }
          if (iVar5 == 0) {
            iVar1 = curl_easy_setopt(lVar3,0x29,1);
            iVar5 = 0;
            if (iVar1 != 0) {
              test_cold_5();
              iVar5 = iVar1;
            }
            if (iVar5 == 0) {
              iVar1 = curl_easy_setopt(lVar3,0x2a,1);
              iVar5 = 0;
              if (iVar1 != 0) {
                test_cold_6();
                iVar5 = iVar1;
              }
              if (iVar5 == 0) goto code_r0x00102711;
            }
          }
        }
      }
      goto LAB_001027ae;
    }
    test_cold_2();
    iVar5 = 0x7b;
LAB_001027ae:
    lVar4 = 0;
    do {
      lVar3 = local_2d8[lVar4];
      curl_multi_remove_handle(lVar2,lVar3);
      curl_easy_cleanup(lVar3);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    curl_multi_cleanup(lVar2);
    curl_global_cleanup();
  }
LAB_001027df:
  return iVar5;
code_r0x00102711:
  iVar1 = curl_multi_add_handle(lVar2,lVar3);
  iVar5 = 0;
  if (iVar1 != 0) {
    test_cold_7();
    iVar5 = iVar1;
  }
  lVar4 = lVar4 + 1;
  if (iVar5 != 0) goto LAB_001027ae;
  goto LAB_0010264e;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];

  for(i=0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  /* get NUM_HANDLES easy handles */
  for(i=0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    sprintf(target_url, "%s%04i", URL, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);
    /* add handle to multi */
    multi_add_handle(m, curl[i]);
  }

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i=0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}